

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::compile_shader(NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  GLuint shader;
  allocator<char> local_71;
  GLuint program;
  allocator<char> local_39;
  string local_38;
  GLuint local_14;
  NegativeTestContext *pNStack_10;
  GLuint notAShader;
  NegativeTestContext *ctx_local;
  
  pNStack_10 = ctx;
  local_14 = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
  glu::CallLogWrapper::glDeleteShader(&pNStack_10->super_CallLogWrapper,local_14);
  pNVar1 = pNStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_VALUE is generated if shader is not a value generated by OpenGL.",&local_39
            );
  NegativeTestContext::beginSection(pNVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  glu::CallLogWrapper::glCompileShader(&pNStack_10->super_CallLogWrapper,local_14);
  NegativeTestContext::expectError(pNStack_10,0x501);
  NegativeTestContext::endSection(pNStack_10);
  pNVar1 = pNStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&program,
             "GL_INVALID_OPERATION is generated if shader is not a shader object.",&local_71);
  NegativeTestContext::beginSection(pNVar1,(string *)&program);
  std::__cxx11::string::~string((string *)&program);
  std::allocator<char>::~allocator(&local_71);
  shader = glu::CallLogWrapper::glCreateProgram(&pNStack_10->super_CallLogWrapper);
  glu::CallLogWrapper::glCompileShader(&pNStack_10->super_CallLogWrapper,shader);
  NegativeTestContext::expectError(pNStack_10,0x502);
  NegativeTestContext::endSection(pNStack_10);
  glu::CallLogWrapper::glDeleteProgram(&pNStack_10->super_CallLogWrapper,shader);
  return;
}

Assistant:

void compile_shader (NegativeTestContext& ctx)
{
	const GLuint notAShader = ctx.glCreateShader(GL_VERTEX_SHADER);
	ctx.glDeleteShader(notAShader);

	ctx.beginSection("GL_INVALID_VALUE is generated if shader is not a value generated by OpenGL.");
	ctx.glCompileShader(notAShader);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if shader is not a shader object.");
	GLuint program = ctx.glCreateProgram();
	ctx.glCompileShader(program);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glDeleteProgram(program);
}